

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExport.c
# Opt level: O2

int Cudd_DumpDot(DdManager *dd,int n,DdNode **f,char **inames,char **onames,FILE *fp)

{
  int *piVar1;
  FILE *pFVar2;
  char **ppcVar3;
  int iVar4;
  void *__ptr;
  DdNode **ppDVar5;
  DdNode *pDVar6;
  st__table *table;
  st__generator *gen;
  DdNode **ppDVar7;
  uint uVar8;
  undefined4 in_register_00000034;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  DdNode **ppDVar12;
  DdNode **ppDVar13;
  DdNode *local_78;
  DdNode **local_70;
  FILE *local_68;
  DdNode **local_60;
  DdManager *local_58;
  DdNode **local_50;
  DdNode **local_48;
  DdNode **local_40;
  char **local_38;
  
  local_70 = (DdNode **)CONCAT44(in_register_00000034,n);
  uVar8 = dd->size;
  local_60 = f;
  __ptr = malloc((long)(int)uVar8 * 4);
  if (__ptr == (void *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    ppDVar5 = (DdNode **)0x0;
    ppDVar13 = (DdNode **)(ulong)uVar8;
    if ((int)uVar8 < 1) {
      ppDVar13 = ppDVar5;
    }
    for (; ppDVar13 != ppDVar5; ppDVar5 = (DdNode **)((long)ppDVar5 + 1)) {
      *(undefined4 *)((long)__ptr + (long)ppDVar5 * 4) = 0;
    }
    pDVar6 = Cudd_VectorSupport(dd,local_60,(int)local_70);
    if (pDVar6 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      for (local_78 = pDVar6; (ulong)local_78->index != 0x7fffffff;
          local_78 = (local_78->type).kids.T) {
        *(undefined4 *)((long)__ptr + (ulong)local_78->index * 4) = 1;
      }
      local_48 = (DdNode **)inames;
      local_38 = onames;
      Cudd_RecursiveDeref(dd,pDVar6);
      table = st__init_table(st__ptrcmp,st__ptrhash);
      ppDVar5 = (DdNode **)0x0;
      if (table != (st__table *)0x0) {
        local_50 = (DdNode **)0x0;
        if (0 < (int)local_70) {
          local_50 = (DdNode **)((ulong)local_70 & 0xffffffff);
        }
        while (local_50 != ppDVar5) {
          iVar4 = cuddCollectNodes((DdNode *)((ulong)local_60[(long)ppDVar5] & 0xfffffffffffffffe),
                                   table);
          ppDVar5 = (DdNode **)((long)ppDVar5 + 1);
          if (iVar4 == 0) goto LAB_00749786;
        }
        pDVar6 = *local_60;
        local_68 = (FILE *)fp;
        local_58 = dd;
        gen = st__init_gen(table);
        if (gen == (st__generator *)0x0) goto LAB_00749786;
        uVar11 = 0;
        ppDVar5 = &local_78;
        while (iVar4 = st__gen(gen,(char **)ppDVar5,(char **)0x0), iVar4 != 0) {
          uVar11 = uVar11 | (ulong)local_78 ^ (ulong)pDVar6 & 0xfffffffffffffffe;
        }
        st__free_gen(gen);
        pFVar2 = local_68;
        uVar8 = 0;
        do {
          if (0x3f < uVar8) break;
          ppDVar5 = (DdNode **)(ulong)(uint)~(-1 << ((byte)uVar8 & 0x1f));
          uVar8 = uVar8 + 4;
        } while ((long)ppDVar5 < (long)uVar11);
        iVar4 = fprintf(local_68,"digraph \"DD\" {\n");
        if (iVar4 == -1) {
          return 0;
        }
        iVar4 = fprintf(pFVar2,"size = \"7.5,10\"\ncenter = true;\nedge [dir = none];\n");
        if (iVar4 == -1) {
          return 0;
        }
        iVar4 = fprintf(pFVar2,"{ node [shape = plaintext];\n");
        if (((iVar4 == -1) || (iVar4 = fprintf(pFVar2,"  edge [style = invis];\n"), iVar4 == -1)) ||
           (iVar4 = fprintf(pFVar2,"  \"CONST NODES\" [style = invis];\n"), iVar4 == -1))
        goto LAB_00749786;
        for (ppDVar12 = (DdNode **)0x0; ppDVar13 != ppDVar12;
            ppDVar12 = (DdNode **)((long)ppDVar12 + 1)) {
          if (*(int *)((long)__ptr + (long)local_58->invperm[(long)ppDVar12] * 4) != 0) {
            if ((local_48 == (DdNode **)0x0) ||
               (local_48[local_58->invperm[(long)ppDVar12]] == (DdNode *)0x0)) {
              iVar4 = fprintf(pFVar2,"\" %d \" -> ");
            }
            else {
              iVar4 = fprintf(pFVar2,"\" %s \" -> ",local_48[local_58->invperm[(long)ppDVar12]]);
            }
            if (iVar4 == -1) goto LAB_00749786;
          }
        }
        iVar4 = fprintf(pFVar2,"\"CONST NODES\"; \n}\n");
        if ((iVar4 != -1) &&
           (iVar4 = fprintf(pFVar2,"{ rank = same; node [shape = box]; edge [style = invis];\n"),
           ppcVar3 = local_38, iVar4 != -1)) {
          local_70 = (DdNode **)(ulong)((int)local_70 - 1);
          ppDVar12 = (DdNode **)0x0;
          while (local_50 != ppDVar12) {
            if (ppcVar3 == (char **)0x0) {
              iVar4 = fprintf(pFVar2,"\"F%d\"",(ulong)ppDVar12 & 0xffffffff);
            }
            else {
              iVar4 = fprintf(pFVar2,"\"  %s  \"",ppcVar3[(long)ppDVar12]);
            }
            if (iVar4 == -1) goto LAB_00749786;
            pcVar9 = " -> ";
            if (local_70 == ppDVar12) {
              pcVar9 = "; }\n";
            }
            iVar4 = fprintf(pFVar2,pcVar9);
            ppDVar12 = (DdNode **)((long)ppDVar12 + 1);
            if (iVar4 == -1) goto LAB_00749786;
          }
          for (ppDVar12 = (DdNode **)0x0; ppDVar12 != ppDVar13;
              ppDVar12 = (DdNode **)((long)ppDVar12 + 1)) {
            if (*(int *)((long)__ptr + (long)local_58->invperm[(long)ppDVar12] * 4) != 0) {
              local_40 = ppDVar12;
              iVar4 = fprintf(pFVar2,"{ rank = same; ");
              if (iVar4 == -1) goto LAB_00749786;
              if ((local_48 == (DdNode **)0x0) ||
                 (local_48[local_58->invperm[(long)local_40]] == (DdNode *)0x0)) {
                iVar4 = fprintf(pFVar2,"\" %d \";\n");
              }
              else {
                iVar4 = fprintf(pFVar2,"\" %s \";\n",local_48[local_58->invperm[(long)local_40]]);
              }
              if (iVar4 == -1) goto LAB_00749786;
              local_70 = local_58->subtables[(long)local_40].nodelist;
              uVar8 = local_58->subtables[(long)local_40].slots;
              uVar11 = (ulong)uVar8;
              if ((int)uVar8 < 1) {
                uVar11 = 0;
              }
              for (uVar10 = 0; uVar10 != uVar11; uVar10 = uVar10 + 1) {
                ppDVar12 = local_70 + uVar10;
                while (local_78 = *ppDVar12, local_78 != (DdNode *)0x0) {
                  iVar4 = st__lookup(table,(char *)local_78,(char **)0x0);
                  if ((iVar4 != 0) &&
                     (iVar4 = fprintf(pFVar2,"\"%lx\";\n",((ulong)local_78 & (ulong)ppDVar5) / 0x28)
                     , iVar4 == -1)) goto LAB_00749786;
                  ppDVar12 = &local_78->next;
                }
              }
              iVar4 = fprintf(pFVar2,"}\n");
              ppDVar12 = local_40;
              if (iVar4 == -1) goto LAB_00749786;
            }
          }
          iVar4 = fprintf(pFVar2,"{ rank = same; \"CONST NODES\";\n{ node [shape = box]; ");
          pFVar2 = local_68;
          if (iVar4 == -1) goto LAB_00749786;
          local_48 = (local_58->constants).nodelist;
          uVar8 = (local_58->constants).slots;
          ppDVar12 = (DdNode **)(ulong)uVar8;
          if ((int)uVar8 < 1) {
            ppDVar12 = (DdNode **)0x0;
          }
          for (local_70 = (DdNode **)0x0; local_70 != ppDVar12;
              local_70 = (DdNode **)((long)local_70 + 1)) {
            ppDVar7 = local_48 + (long)local_70;
            while (local_78 = *ppDVar7, local_78 != (DdNode *)0x0) {
              iVar4 = st__lookup(table,(char *)local_78,(char **)0x0);
              if ((iVar4 != 0) &&
                 (iVar4 = fprintf(pFVar2,"\"%lx\";\n",((ulong)local_78 & (ulong)ppDVar5) / 0x28),
                 iVar4 == -1)) goto LAB_00749786;
              ppDVar7 = &local_78->next;
            }
          }
          iVar4 = fprintf(local_68,"}\n}\n");
          if (iVar4 != -1) {
            ppDVar12 = (DdNode **)0x0;
            do {
              if (local_50 == ppDVar12) {
                for (local_60 = (DdNode **)0x0; local_60 != ppDVar13;
                    local_60 = (DdNode **)((long)local_60 + 1)) {
                  if (*(int *)((long)__ptr + (long)local_58->invperm[(long)local_60] * 4) != 0) {
                    local_70 = local_58->subtables[(long)local_60].nodelist;
                    uVar8 = local_58->subtables[(long)local_60].slots;
                    if ((int)uVar8 < 1) {
                      uVar8 = 0;
                    }
                    for (local_50 = (DdNode **)0x0; local_50 != (DdNode **)(ulong)uVar8;
                        local_50 = (DdNode **)((long)local_50 + 1)) {
                      ppDVar12 = local_70 + (long)local_50;
                      while (local_78 = *ppDVar12, local_78 != (DdNode *)0x0) {
                        iVar4 = st__lookup(table,(char *)local_78,(char **)0x0);
                        if (iVar4 != 0) {
                          iVar4 = fprintf(local_68,"\"%lx\" -> \"%lx\";\n",
                                          ((ulong)ppDVar5 & (ulong)local_78) / 0x28,
                                          ((ulong)(local_78->type).kids.T & (ulong)ppDVar5) / 0x28);
                          if (iVar4 == -1) goto LAB_00749786;
                          pDVar6 = (local_78->type).kids.E;
                          pcVar9 = "\"%lx\" -> \"%lx\" [style = dotted];\n";
                          if (((ulong)pDVar6 & 1) == 0) {
                            pcVar9 = "\"%lx\" -> \"%lx\" [style = dashed];\n";
                          }
                          iVar4 = fprintf(local_68,pcVar9,((ulong)local_78 & (ulong)ppDVar5) / 0x28,
                                          ((ulong)pDVar6 & (ulong)ppDVar5) / 0x28);
                          if (iVar4 == -1) goto LAB_00749786;
                        }
                        ppDVar12 = &local_78->next;
                      }
                    }
                  }
                }
                ppDVar13 = (local_58->constants).nodelist;
                uVar8 = (local_58->constants).slots;
                uVar10 = 0;
                uVar11 = (ulong)uVar8;
                if ((int)uVar8 < 1) {
                  uVar11 = uVar10;
                }
                for (; uVar10 != uVar11; uVar10 = uVar10 + 1) {
                  ppDVar12 = ppDVar13 + uVar10;
                  while (local_78 = *ppDVar12, local_78 != (DdNode *)0x0) {
                    iVar4 = st__lookup(table,(char *)local_78,(char **)0x0);
                    if ((iVar4 != 0) &&
                       (iVar4 = fprintf(local_68,"\"%lx\" [label = \"%g\"];\n",
                                        (local_78->type).value,
                                        ((ulong)ppDVar5 & (ulong)local_78) / 0x28), iVar4 == -1))
                    goto LAB_00749786;
                    ppDVar12 = &local_78->next;
                  }
                }
                iVar4 = fprintf(local_68,"}\n");
                if (iVar4 != -1) {
                  st__free_table(table);
                  free(__ptr);
                  return 1;
                }
                break;
              }
              if (local_38 == (char **)0x0) {
                iVar4 = fprintf(local_68,"\"F%d\"",(ulong)ppDVar12 & 0xffffffff);
              }
              else {
                iVar4 = fprintf(local_68,"\"  %s  \"",local_38[(long)ppDVar12]);
              }
              if (iVar4 == -1) break;
              pcVar9 = " -> \"%lx\" [style = dotted];\n";
              if (((ulong)local_60[(long)ppDVar12] & 1) == 0) {
                pcVar9 = " -> \"%lx\" [style = solid];\n";
              }
              iVar4 = fprintf(local_68,pcVar9,
                              ((ulong)local_60[(long)ppDVar12] & (ulong)ppDVar5) / 0x28);
              ppDVar12 = (DdNode **)((long)ppDVar12 + 1);
            } while (iVar4 != -1);
          }
        }
        goto LAB_00749786;
      }
    }
  }
  table = (st__table *)0x0;
LAB_00749786:
  free(__ptr);
  if (table != (st__table *)0x0) {
    st__free_table(table);
  }
  return 0;
}

Assistant:

int
Cudd_DumpDot(
  DdManager * dd /* manager */,
  int  n /* number of output nodes to be dumped */,
  DdNode ** f /* array of output nodes to be dumped */,
  char ** inames /* array of input names (or NULL) */,
  char ** onames /* array of output names (or NULL) */,
  FILE * fp /* pointer to the dump file */)
{
    DdNode      *support = NULL;
    DdNode      *scan;
    int         *sorted = NULL;
    int         nvars = dd->size;
    st__table    *visited = NULL;
    st__generator *gen = NULL;
    int         retval;
    int         i, j;
    int         slots;
    DdNodePtr   *nodelist;
    long        refAddr, diff, mask;

    /* Build a bit array with the support of f. */
    sorted = ABC_ALLOC(int,nvars);
    if (sorted == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        goto failure;
    }
    for (i = 0; i < nvars; i++) sorted[i] = 0;

    /* Take the union of the supports of each output function. */
    support = Cudd_VectorSupport(dd,f,n);
    if (support == NULL) goto failure;
    cuddRef(support);
    scan = support;
    while (!cuddIsConstant(scan)) {
        sorted[scan->index] = 1;
        scan = cuddT(scan);
    }
    Cudd_RecursiveDeref(dd,support);
    support = NULL; /* so that we do not try to free it in case of failure */

    /* Initialize symbol table for visited nodes. */
    visited = st__init_table( st__ptrcmp, st__ptrhash);
    if (visited == NULL) goto failure;

    /* Collect all the nodes of this DD in the symbol table. */
    for (i = 0; i < n; i++) {
        retval = cuddCollectNodes(Cudd_Regular(f[i]),visited);
        if (retval == 0) goto failure;
    }

    /* Find how many most significant hex digits are identical
    ** in the addresses of all the nodes. Build a mask based
    ** on this knowledge, so that digits that carry no information
    ** will not be printed. This is done in two steps.
    **  1. We scan the symbol table to find the bits that differ
    **     in at least 2 addresses.
    **  2. We choose one of the possible masks. There are 8 possible
    **     masks for 32-bit integer, and 16 possible masks for 64-bit
    **     integers.
    */

    /* Find the bits that are different. */
    refAddr = (long) Cudd_Regular(f[0]);
    diff = 0;
    gen = st__init_gen(visited);
    if (gen == NULL) goto failure;
    while ( st__gen(gen, (const char **)&scan, NULL)) {
        diff |= refAddr ^ (long) scan;
    }
    st__free_gen(gen); gen = NULL;

    /* Choose the mask. */
    for (i = 0; (unsigned) i < 8 * sizeof(long); i += 4) {
        mask = (1 << i) - 1;
        if (diff <= mask) break;
    }

    /* Write the header and the global attributes. */
    retval = fprintf(fp,"digraph \"DD\" {\n");
    if (retval == EOF) return(0);
    retval = fprintf(fp,
        "size = \"7.5,10\"\ncenter = true;\nedge [dir = none];\n");
    if (retval == EOF) return(0);

    /* Write the input name subgraph by scanning the support array. */
    retval = fprintf(fp,"{ node [shape = plaintext];\n");
    if (retval == EOF) goto failure;
    retval = fprintf(fp,"  edge [style = invis];\n");
    if (retval == EOF) goto failure;
    /* We use a name ("CONST NODES") with an embedded blank, because
    ** it is unlikely to appear as an input name.
    */
    retval = fprintf(fp,"  \"CONST NODES\" [style = invis];\n");
    if (retval == EOF) goto failure;
    for (i = 0; i < nvars; i++) {
        if (sorted[dd->invperm[i]]) {
            if (inames == NULL || inames[dd->invperm[i]] == NULL) {
                retval = fprintf(fp,"\" %d \" -> ", dd->invperm[i]);
            } else {
                retval = fprintf(fp,"\" %s \" -> ", inames[dd->invperm[i]]);
            }
            if (retval == EOF) goto failure;
        }
    }
    retval = fprintf(fp,"\"CONST NODES\"; \n}\n");
    if (retval == EOF) goto failure;

    /* Write the output node subgraph. */
    retval = fprintf(fp,"{ rank = same; node [shape = box]; edge [style = invis];\n");
    if (retval == EOF) goto failure;
    for (i = 0; i < n; i++) {
        if (onames == NULL) {
            retval = fprintf(fp,"\"F%d\"", i);
        } else {
            retval = fprintf(fp,"\"  %s  \"", onames[i]);
        }
        if (retval == EOF) goto failure;
        if (i == n - 1) {
            retval = fprintf(fp,"; }\n");
        } else {
            retval = fprintf(fp," -> ");
        }
        if (retval == EOF) goto failure;
    }

    /* Write rank info: All nodes with the same index have the same rank. */
    for (i = 0; i < nvars; i++) {
        if (sorted[dd->invperm[i]]) {
            retval = fprintf(fp,"{ rank = same; ");
            if (retval == EOF) goto failure;
            if (inames == NULL || inames[dd->invperm[i]] == NULL) {
                retval = fprintf(fp,"\" %d \";\n", dd->invperm[i]);
            } else {
                retval = fprintf(fp,"\" %s \";\n", inames[dd->invperm[i]]);
            }
            if (retval == EOF) goto failure;
            nodelist = dd->subtables[i].nodelist;
            slots = dd->subtables[i].slots;
            for (j = 0; j < slots; j++) {
                scan = nodelist[j];
                while (scan != NULL) {
                    if ( st__is_member(visited,(char *) scan)) {
                        retval = fprintf(fp,"\"%lx\";\n", ((mask & (ptrint) scan) / sizeof(DdNode)));
                        if (retval == EOF) goto failure;
                    }
                    scan = scan->next;
                }
            }
            retval = fprintf(fp,"}\n");
            if (retval == EOF) goto failure;
        }
    }

    /* All constants have the same rank. */
    retval = fprintf(fp,
        "{ rank = same; \"CONST NODES\";\n{ node [shape = box]; ");
    if (retval == EOF) goto failure;
    nodelist = dd->constants.nodelist;
    slots = dd->constants.slots;
    for (j = 0; j < slots; j++) {
        scan = nodelist[j];
        while (scan != NULL) {
            if ( st__is_member(visited,(char *) scan)) {
                retval = fprintf(fp,"\"%lx\";\n", ((mask & (ptrint) scan) / sizeof(DdNode)));
                if (retval == EOF) goto failure;
            }
            scan = scan->next;
        }
    }
    retval = fprintf(fp,"}\n}\n");
    if (retval == EOF) goto failure;

    /* Write edge info. */
    /* Edges from the output nodes. */
    for (i = 0; i < n; i++) {
        if (onames == NULL) {
            retval = fprintf(fp,"\"F%d\"", i);
        } else {
            retval = fprintf(fp,"\"  %s  \"", onames[i]);
        }
        if (retval == EOF) goto failure;
        /* Account for the possible complement on the root. */
        if (Cudd_IsComplement(f[i])) {
            retval = fprintf(fp," -> \"%lx\" [style = dotted];\n", ((mask & (ptrint) f[i]) / sizeof(DdNode)));
        } else {
            retval = fprintf(fp," -> \"%lx\" [style = solid];\n", ((mask & (ptrint) f[i]) / sizeof(DdNode)));
        }
        if (retval == EOF) goto failure;
    }

    /* Edges from internal nodes. */
    for (i = 0; i < nvars; i++) {
        if (sorted[dd->invperm[i]]) {
            nodelist = dd->subtables[i].nodelist;
            slots = dd->subtables[i].slots;
            for (j = 0; j < slots; j++) {
                scan = nodelist[j];
                while (scan != NULL) {
                    if ( st__is_member(visited,(char *) scan)) {
                        retval = fprintf(fp, "\"%lx\" -> \"%lx\";\n", 
                            ((mask & (ptrint) scan) / sizeof(DdNode)),
                            ((mask & (ptrint) cuddT(scan)) / sizeof(DdNode)));
                        if (retval == EOF) goto failure;
                        if (Cudd_IsComplement(cuddE(scan))) {
                            retval = fprintf(fp,"\"%lx\" -> \"%lx\" [style = dotted];\n", 
                                ((mask & (ptrint) scan) / sizeof(DdNode)),
                                ((mask & (ptrint) cuddE(scan)) / sizeof(DdNode)));
                        } else {
                            retval = fprintf(fp, "\"%lx\" -> \"%lx\" [style = dashed];\n", 
                                ((mask & (ptrint) scan) / sizeof(DdNode)),
                                ((mask & (ptrint) cuddE(scan)) / sizeof(DdNode)));
                        }
                        if (retval == EOF) goto failure;
                    }
                    scan = scan->next;
                }
            }
        }
    }

    /* Write constant labels. */
    nodelist = dd->constants.nodelist;
    slots = dd->constants.slots;
    for (j = 0; j < slots; j++) {
        scan = nodelist[j];
        while (scan != NULL) {
            if ( st__is_member(visited,(char *) scan)) {
                retval = fprintf(fp,"\"%lx\" [label = \"%g\"];\n", 
                    ((mask & (ptrint) scan) / sizeof(DdNode)), cuddV(scan));
                if (retval == EOF) goto failure;
            }
            scan = scan->next;
        }
    }

    /* Write trailer and return. */
    retval = fprintf(fp,"}\n");
    if (retval == EOF) goto failure;

    st__free_table(visited);
    ABC_FREE(sorted);
    return(1);

failure:
    if (sorted != NULL) ABC_FREE(sorted);
    if (support != NULL) Cudd_RecursiveDeref(dd,support);
    if (visited != NULL) st__free_table(visited);
    return(0);

}